

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

long __thiscall Omega_h::Read<long>::last(Read<long> *this)

{
  Alloc *pAVar1;
  long lVar2;
  size_t sVar3;
  ScopedTimer timer;
  ScopedTimer local_11;
  
  pAVar1 = (this->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  begin_code("single device to host",(char *)0x0);
  lVar2 = *(long *)((long)(this->write_).shared_alloc_.direct_ptr +
                   ((long)(sVar3 * 0x20000000 + -0x100000000) >> 0x20) * 8);
  ScopedTimer::~ScopedTimer(&local_11);
  return lVar2;
}

Assistant:

T Read<T>::last() const {
  return get(size() - 1);
}